

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void prt_map_aux(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  term *t_00;
  chunk_conflict *c_00;
  term *t_01;
  _Bool _Var5;
  wchar_t clipy_00;
  loc_conflict grid;
  loc grid_00;
  uint uVar6;
  uint uVar7;
  int local_98;
  term_conflict *old;
  wchar_t clipy;
  term_conflict *t;
  wchar_t j;
  wchar_t tx;
  wchar_t ty;
  wchar_t vx;
  wchar_t vy;
  wchar_t x;
  wchar_t y;
  grid_data g;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  
  for (t._4_4_ = 0; t_01 = Term, t._4_4_ < 8; t._4_4_ = t._4_4_ + 1) {
    t_00 = angband_term[t._4_4_];
    if ((t_00 != (term *)0x0) && ((window_flag[t._4_4_] & 0xa0) != 0)) {
      if ((window_flag[t._4_4_] & 0x20) == 0) {
        iVar1 = t_00->offset_y;
        iVar2 = t_00->hgt;
        uVar6 = (uint)tile_height;
        iVar3 = t_00->offset_x;
        iVar4 = t_00->wid;
        uVar7 = (uint)tile_width;
        if ((window_flag[t._4_4_] & 0x80) == 0) {
          local_98 = row_bottom_map[Term->sidebar_mode];
        }
        else {
          local_98 = 0;
        }
        clipy_00 = t_00->hgt - local_98;
        vy = t_00->offset_y;
        ty = L'\0';
        for (; vy < iVar1 + iVar2 / (int)uVar6; vy = vy + L'\x01') {
          vx = t_00->offset_x;
          tx = L'\0';
          for (; c_00 = cave, vx < iVar3 + iVar4 / (int)uVar7; vx = vx + L'\x01') {
            grid = (loc_conflict)loc(vx,vy);
            _Var5 = square_in_bounds((chunk *)c_00,grid);
            if (_Var5) {
              grid_00 = loc(vx,vy);
              map_info(grid_00,(grid_data *)&x);
              grid_data_as_text((grid_data *)&x,&c,(wchar_t *)&g.field_0x24,&tc,
                                (wchar_t *)&g.in_view);
              Term_queue_char(t_00,tx,ty,c,g._36_4_,tc,g._32_4_);
              if ((1 < tile_width) || (1 < tile_height)) {
                Term_big_queue_char(t_00,tx,ty,clipy_00,L'ÿ',L'\xffffffff',L'\0',L'\0');
              }
            }
            else {
              Term_queue_char(t_00,tx,ty,L'\x01',L' ',L'\0',L'\0');
              if ((1 < tile_width) || (1 < tile_height)) {
                Term_big_queue_char(t_00,tx,ty,clipy_00,L'\x01',L' ',L'\0',L'\0');
              }
            }
            tx = (uint)tile_width + tx;
          }
          for (; tx < t_00->wid; tx = tx + L'\x01') {
            Term_queue_char(t_00,tx,ty,L'\x01',L' ',L'\0',L'\0');
          }
          ty = (uint)tile_height + ty;
        }
        for (; ty < t_00->hgt; ty = ty + L'\x01') {
          for (tx = L'\0'; tx < t_00->wid; tx = tx + L'\x01') {
            Term_queue_char(t_00,tx,ty,L'\x01',L' ',L'\0',L'\0');
          }
        }
      }
      else {
        Term_activate(t_00);
        display_map((int *)0x0,(int *)0x0);
        Term_activate(t_01);
      }
    }
  }
  return;
}

Assistant:

static void prt_map_aux(void)
{
	int a, ta;
	wchar_t c, tc;
	struct grid_data g;

	int y, x;
	int vy, vx;
	int ty, tx;

	int j;

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		term *t = angband_term[j];
		int clipy;

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if (!(window_flag[j] & (PW_MAPS))) continue;

		if (window_flag[j] & PW_MAP) {
			term *old = Term;

			Term_activate(t);
			display_map(NULL, NULL);
			Term_activate(old);
			continue;
		}

		/* Assume screen */
		ty = t->offset_y + (t->hgt / tile_height);
		tx = t->offset_x + (t->wid / tile_width);

		/*
		 * The overhead view can use the last row of the terminal.
		 * Others can not.
		 */
		clipy = t->hgt - ((window_flag[j] & PW_OVERHEAD) ? 0 : ROW_BOTTOM_MAP);

		/* Dump the map */
		for (y = t->offset_y, vy = 0; y < ty; vy += tile_height, y++) {
			for (x = t->offset_x, vx = 0; x < tx; vx += tile_width, x++) {
				/* Check bounds */
				if (!square_in_bounds(cave, loc(x, y))) {
					Term_queue_char(t, vx, vy,
						COLOUR_WHITE, ' ',
						0, 0);
					if (tile_width > 1 || tile_height > 1) {
						Term_big_queue_char(t, vx, vy,
							clipy, COLOUR_WHITE, ' ', 0, 0);
					}
					continue;
				}

				/* Determine what is there */
				map_info(loc(x, y), &g);
				grid_data_as_text(&g, &a, &c, &ta, &tc);
				Term_queue_char(t, vx, vy, a, c, ta, tc);

				if ((tile_width > 1) || (tile_height > 1))
					Term_big_queue_char(t, vx, vy, clipy,
						255, -1, 0, 0);
			}
			/* Clear partial tile at the end of each line. */
			for (; vx < t->wid; ++vx) {
				Term_queue_char(t, vx, vy, COLOUR_WHITE,
					' ', 0, 0);
			}
		}
		/* Clear row of partial tiles at the bottom. */
		for (; vy < t->hgt; ++vy) {
			for (vx = 0; vx < t->wid; ++vx) {
				Term_queue_char(t, vx, vy, COLOUR_WHITE,
					' ', 0, 0);
			}
		}
	}
}